

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

void __thiscall FTextureManager::WriteTexture(FTextureManager *this,FArchive *arc,int picnum)

{
  uint uVar1;
  TextureHash *pTVar2;
  FTexture *pFVar3;
  char *pcVar4;
  FTexture *local_28;
  FTexture *pic;
  int picnum_local;
  FArchive *arc_local;
  FTextureManager *this_local;
  
  if (picnum < 0) {
    FArchive::WriteName(arc,(char *)0x0);
  }
  else {
    uVar1 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Size
                      (&this->Textures);
    if ((ulong)(long)picnum < (ulong)uVar1) {
      pTVar2 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::operator[]
                         (&this->Textures,(long)picnum);
      local_28 = pTVar2->Texture;
    }
    else {
      pTVar2 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::operator[]
                         (&this->Textures,0);
      local_28 = pTVar2->Texture;
    }
    pFVar3 = FWadCollection::GetLinkedTexture(&Wads,local_28->SourceLump);
    if (pFVar3 == local_28) {
      pcVar4 = FWadCollection::GetLumpFullName(&Wads,local_28->SourceLump);
      FArchive::WriteName(arc,pcVar4);
    }
    else {
      pcVar4 = FString::operator_cast_to_char_(&local_28->Name);
      FArchive::WriteName(arc,pcVar4);
    }
    FArchive::WriteCount(arc,(uint)local_28->UseType);
  }
  return;
}

Assistant:

void FTextureManager::WriteTexture (FArchive &arc, int picnum)
{
	FTexture *pic;

	if (picnum < 0)
	{
		arc.WriteName(NULL);
		return;
	}
	else if ((size_t)picnum >= Textures.Size())
	{
		pic = Textures[0].Texture;
	}
	else
	{
		pic = Textures[picnum].Texture;
	}

	if (Wads.GetLinkedTexture(pic->SourceLump) == pic)
	{
		arc.WriteName(Wads.GetLumpFullName(pic->SourceLump));
	}
	else
	{
		arc.WriteName(pic->Name);
	}
	arc.WriteCount(pic->UseType);
}